

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathCheckOpLimit(xmlXPathParserContextPtr ctxt,unsigned_long opCount)

{
  xmlXPathContextPtr pxVar1;
  xmlXPathContextPtr xpctxt;
  unsigned_long opCount_local;
  xmlXPathParserContextPtr ctxt_local;
  
  pxVar1 = ctxt->context;
  if ((pxVar1->opLimit < opCount) || (pxVar1->opLimit - opCount < pxVar1->opCount)) {
    pxVar1->opCount = pxVar1->opLimit;
    xmlXPathErr(ctxt,0x19);
    ctxt_local._4_4_ = -1;
  }
  else {
    pxVar1->opCount = opCount + pxVar1->opCount;
    ctxt_local._4_4_ = 0;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlXPathCheckOpLimit(xmlXPathParserContextPtr ctxt, unsigned long opCount) {
    xmlXPathContextPtr xpctxt = ctxt->context;

    if ((opCount > xpctxt->opLimit) ||
        (xpctxt->opCount > xpctxt->opLimit - opCount)) {
        xpctxt->opCount = xpctxt->opLimit;
        xmlXPathErr(ctxt, XPATH_OP_LIMIT_EXCEEDED);
        return(-1);
    }

    xpctxt->opCount += opCount;
    return(0);
}